

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::Node>::freeData
          (Span<QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::Node> *this)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  
  if (*(long *)(this + 0x80) != 0) {
    lVar5 = 0;
    do {
      if ((ulong)(byte)this[lVar5] != 0xff) {
        lVar2 = *(long *)(this + 0x80);
        lVar4 = (ulong)(byte)this[lVar5] * 0x38;
        lVar1 = lVar2 + lVar4;
        QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::Value::~Value
                  ((Value *)(lVar1 + 0x28));
        piVar3 = *(int **)(lVar1 + 0x10);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate(*(QArrayData **)(lVar2 + lVar4 + 0x10),1,0x10);
          }
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x80);
    if (*(void **)(this + 0x80) != (void *)0x0) {
      operator_delete__(*(void **)(this + 0x80));
    }
    *(undefined8 *)(this + 0x80) = 0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }